

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusNonStationary.cpp
# Opt level: O0

void __thiscall PerseusNonStationary::Load(PerseusNonStationary *this,string *filename)

{
  PlanningUnitDecPOMDPDiscrete *this_00;
  PlanningUnitMADPDiscrete *this_01;
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  *__x;
  AlphaVectorPlanning *in_RSI;
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  *in_RDI;
  size_t in_stack_000001c0;
  size_t in_stack_000001c8;
  size_t in_stack_000001d0;
  string *in_stack_000001d8;
  
  this_00 = AlphaVectorPlanning::GetPU(in_RSI);
  this_01 = (PlanningUnitMADPDiscrete *)PlanningUnit::GetHorizon((PlanningUnit *)this_00);
  AlphaVectorPlanning::GetPU(in_RSI);
  __x = (vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
         *)PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x95bf43);
  AlphaVectorPlanning::GetPU(in_RSI);
  PlanningUnitMADPDiscrete::GetNrStates(this_01);
  AlphaVectorPlanning::ImportValueFunction
            (in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  std::
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ::operator=(in_RDI,__x);
  std::
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ::~vector(in_RDI);
  return;
}

Assistant:

void PerseusNonStationary::Load(const std::string &filename)
{
    _m_qFunctions=ImportValueFunction(filename,
                                      GetPU()->GetHorizon(),
                                      GetPU()->GetNrJointActions(),
                                      GetPU()->GetNrStates());
}